

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall Assimp::IFC::Schema_2x3::IfcRelDecomposes::~IfcRelDecomposes(IfcRelDecomposes *this)

{
  void *pvVar1;
  
  *(undefined ***)this = &PTR__IfcRelDecomposes_00822200;
  *(undefined ***)&this->field_0xc8 = &PTR__IfcRelDecomposes_00822278;
  *(undefined ***)&this->field_0x88 = &PTR__IfcRelDecomposes_00822228;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRelDecomposes,_2UL>)._vptr_ObjectHelper =
       (_func_int **)&PTR__IfcRelDecomposes_00822250;
  pvVar1 = *(void **)&(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRelDecomposes,_2UL>).
                      field_0x18;
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1,*(long *)&this->field_0xc0 - (long)pvVar1);
  }
  *(undefined8 *)this = 0x822390;
  *(undefined8 *)&this->field_0xc8 = 0x8223b8;
  if (*(undefined1 **)&this->field_0x60 != &this->field_0x70) {
    operator_delete(*(undefined1 **)&this->field_0x60,*(long *)&this->field_0x70 + 1);
  }
  if (*(undefined1 **)&this->field_0x38 != &this->field_0x48) {
    operator_delete(*(undefined1 **)&this->field_0x38,*(long *)&this->field_0x48 + 1);
  }
  if (*(undefined1 **)&this->field_0x10 != &this->field_0x20) {
    operator_delete(*(undefined1 **)&this->field_0x10,*(long *)&this->field_0x20 + 1);
  }
  operator_delete(this,0xe0);
  return;
}

Assistant:

IfcRelDecomposes() : Object("IfcRelDecomposes") {}